

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall
QCompletionEngine::saveInCache
          (QCompletionEngine *this,QString *part,QModelIndex *parent,QMatchData *m)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QMap<QString,_QMatchData> *pQVar4;
  size_type_conflict sVar5;
  QMatchData *in_RCX;
  const_iterator in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  int sz;
  CacheItem *ci;
  iterator it2;
  iterator it1;
  QMatchData old;
  QMatchData *in_stack_fffffffffffffef8;
  QString *in_stack_ffffffffffffff00;
  QMap<QModelIndex,_QMap<QString,_QMatchData>_> *in_stack_ffffffffffffff08;
  QMap<QString,_QMatchData> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  undefined4 in_stack_ffffffffffffff20;
  int iVar6;
  undefined4 in_stack_ffffffffffffff24;
  int local_c8;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::operator==((QFlagsStorageHelper<Qt::MatchFlag,_4>)
                       SUB84((ulong)in_stack_ffffffffffffff08 >> 0x20,0),
                       (MatchFlag)in_stack_ffffffffffffff00);
  if (!bVar1) {
    memset(local_38,0xaa,0x30);
    QMap<QModelIndex,_QMap<QString,_QMatchData>_>::operator[]
              ((QMap<QModelIndex,_QMap<QString,_QMatchData>_> *)in_RSI._M_node,
               (QModelIndex *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    QMap<QString,_QMatchData>::take
              ((QMap<QString,_QMatchData> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (QString *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    iVar6 = *(int *)(in_RDI + 0xb0);
    iVar2 = QIndexMapper::cost((QIndexMapper *)0xa6acc7);
    iVar2 = iVar6 + iVar2;
    iVar3 = QIndexMapper::cost((QIndexMapper *)0xa6ace0);
    *(int *)(in_RDI + 0xb0) = iVar2 - iVar3;
    if (0x100000 < (ulong)((long)*(int *)(in_RDI + 0xb0) * 4)) {
      QMap<QModelIndex,_QMap<QString,_QMatchData>_>::begin
                ((QMap<QModelIndex,_QMap<QString,_QMatchData>_> *)in_stack_ffffffffffffff10);
      while( true ) {
        QMap<QModelIndex,_QMap<QString,_QMatchData>_>::end
                  ((QMap<QModelIndex,_QMap<QString,_QMatchData>_> *)in_stack_ffffffffffffff10);
        bVar1 = ::operator!=((iterator *)in_stack_ffffffffffffff00,
                             (iterator *)in_stack_fffffffffffffef8);
        if (!bVar1) break;
        pQVar4 = QMap<QModelIndex,_QMap<QString,_QMatchData>_>::iterator::value
                           ((iterator *)0xa6ad85);
        sVar5 = QMap<QString,_QMatchData>::size
                          ((QMap<QString,_QMatchData> *)in_stack_ffffffffffffff00);
        QMap<QString,_QMatchData>::begin(in_stack_ffffffffffffff10);
        local_c8 = 0;
        while( true ) {
          QMap<QString,_QMatchData>::end(in_stack_ffffffffffffff10);
          bVar1 = ::operator!=((iterator *)in_stack_ffffffffffffff00,
                               (iterator *)in_stack_fffffffffffffef8);
          if (!bVar1 || (int)(sVar5 / 2) <= local_c8) break;
          QMap<QString,_QMatchData>::iterator::value((iterator *)0xa6ae2a);
          iVar3 = QIndexMapper::cost((QIndexMapper *)0xa6ae32);
          *(int *)(in_RDI + 0xb0) = *(int *)(in_RDI + 0xb0) - iVar3;
          in_stack_ffffffffffffff10 = pQVar4;
          QMap<QString,_QMatchData>::const_iterator::const_iterator
                    ((const_iterator *)in_stack_ffffffffffffff00,
                     (iterator *)in_stack_fffffffffffffef8);
          QMap<QString,_QMatchData>::erase
                    ((QMap<QString,_QMatchData> *)in_stack_ffffffffffffff08,
                     (const_iterator)in_RSI._M_node);
          local_c8 = local_c8 + 1;
        }
        sVar5 = QMap<QString,_QMatchData>::size
                          ((QMap<QString,_QMatchData> *)in_stack_ffffffffffffff00);
        if (sVar5 == 0) {
          in_stack_ffffffffffffff08 =
               (QMap<QModelIndex,_QMap<QString,_QMatchData>_> *)(in_RDI + 0xa8);
          QMap<QModelIndex,_QMap<QString,_QMatchData>_>::const_iterator::const_iterator
                    ((const_iterator *)in_stack_ffffffffffffff00,
                     (iterator *)in_stack_fffffffffffffef8);
          QMap<QModelIndex,_QMap<QString,_QMatchData>_>::erase
                    (in_stack_ffffffffffffff08,(const_iterator)in_RSI._M_node);
        }
        else {
          QMap<QModelIndex,_QMap<QString,_QMatchData>_>::iterator::operator++
                    ((iterator *)in_stack_ffffffffffffff00);
        }
      }
    }
    if (*(int *)(*(long *)(in_RDI + 0x68) + 0xb8) == 0) {
      QString::toLower((QString *)in_stack_fffffffffffffef8);
      QString::operator=(in_stack_ffffffffffffff00,(QString *)in_stack_fffffffffffffef8);
      QString::~QString((QString *)0xa6af4f);
    }
    QMap<QModelIndex,_QMap<QString,_QMatchData>_>::operator[]
              ((QMap<QModelIndex,_QMap<QString,_QMatchData>_> *)in_RSI._M_node,
               (QModelIndex *)CONCAT44(iVar2,iVar6));
    QMap<QString,_QMatchData>::operator[]
              ((QMap<QString,_QMatchData> *)in_RSI._M_node,(QString *)CONCAT44(iVar2,iVar6));
    QMatchData::operator=(in_RCX,in_stack_fffffffffffffef8);
    QMatchData::~QMatchData((QMatchData *)0xa6af96);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompletionEngine::saveInCache(QString part, const QModelIndex& parent, const QMatchData& m)
{
    if (c->filterMode == Qt::MatchEndsWith)
        return;
    QMatchData old = cache[parent].take(part);
    cost = cost + m.indices.cost() - old.indices.cost();
    if (cost * sizeof(int) > 1024 * 1024) {
        QMap<QModelIndex, CacheItem>::iterator it1 = cache.begin();
        while (it1 != cache.end()) {
            CacheItem& ci = it1.value();
            int sz = ci.size()/2;
            QMap<QString, QMatchData>::iterator it2 = ci.begin();
            int i = 0;
            while (it2 != ci.end() && i < sz) {
                cost -= it2.value().indices.cost();
                it2 = ci.erase(it2);
                i++;
            }
            if (ci.size() == 0) {
              it1 = cache.erase(it1);
            } else {
              ++it1;
            }
        }
    }

    if (c->cs == Qt::CaseInsensitive)
        part = std::move(part).toLower();
    cache[parent][part] = m;
}